

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.hpp
# Opt level: O2

DatatypeValidator * __thiscall
xercesc_4_0::DatatypeValidatorFactory::getDatatypeValidator
          (DatatypeValidatorFactory *this,XMLCh *dvType)

{
  bool bVar1;
  DatatypeValidator *pDVar2;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> **ppRVar3;
  
  if (dvType != (XMLCh *)0x0) {
    ppRVar3 = &fBuiltInRegistry;
    if (fBuiltInRegistry !=
        (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0) {
      bVar1 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::containsKey
                        (fBuiltInRegistry,dvType);
      if (bVar1) goto LAB_002e62bf;
    }
    if (this->fUserDefinedRegistry !=
        (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0) {
      bVar1 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::containsKey
                        (this->fUserDefinedRegistry,dvType);
      if (bVar1) {
        ppRVar3 = &this->fUserDefinedRegistry;
LAB_002e62bf:
        pDVar2 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (*ppRVar3,dvType);
        return pDVar2;
      }
    }
  }
  return (DatatypeValidator *)0x0;
}

Assistant:

inline DatatypeValidator*
DatatypeValidatorFactory::getDatatypeValidator(const XMLCh* const dvType) const
{
	if (dvType) {
        if (fBuiltInRegistry && fBuiltInRegistry->containsKey(dvType)) {
		    return fBuiltInRegistry->get(dvType);
        }

        if (fUserDefinedRegistry && fUserDefinedRegistry->containsKey(dvType)) {
		    return fUserDefinedRegistry->get(dvType);

        }
    }
	return 0;
}